

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3RollbackAll(sqlite3 *db,int tripCode)

{
  byte *pbVar1;
  Btree *p;
  bool bVar2;
  Vdbe *pVVar3;
  long lVar4;
  uint writeOnly;
  long lVar5;
  
  if (sqlite3Hooks_0 != (code *)0x0) {
    (*sqlite3Hooks_0)();
  }
  sqlite3BtreeEnterAll(db);
  writeOnly = 1;
  if ((db->flags & 2) != 0) {
    writeOnly = (uint)((db->init).busy != '\0');
  }
  if (db->nDb < 1) {
    bVar2 = true;
  }
  else {
    lVar5 = 0;
    lVar4 = 8;
    bVar2 = false;
    do {
      p = *(Btree **)((long)&db->aDb->zName + lVar4);
      if (p != (Btree *)0x0) {
        if (p->inTrans == '\x02') {
          bVar2 = true;
        }
        sqlite3BtreeRollback(p,tripCode,writeOnly);
      }
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x20;
    } while (lVar5 < db->nDb);
    bVar2 = !bVar2;
  }
  callFinaliser(db,0x88);
  if (sqlite3Hooks_1 != (code *)0x0) {
    (*sqlite3Hooks_1)();
  }
  if (((db->flags & 2) != 0) && ((db->init).busy == '\0')) {
    for (pVVar3 = db->pVdbe; pVVar3 != (Vdbe *)0x0; pVVar3 = pVVar3->pNext) {
      pVVar3->field_0x8c = pVVar3->field_0x8c | 8;
    }
    sqlite3ResetAllSchemasOfConnection(db);
  }
  sqlite3BtreeLeaveAll(db);
  db->nDeferredCons = 0;
  db->nDeferredImmCons = 0;
  pbVar1 = (byte *)((long)&db->flags + 3);
  *pbVar1 = *pbVar1 & 0xfe;
  if ((db->xRollbackCallback != (_func_void_void_ptr *)0x0) &&
     ((!bVar2 || (db->autoCommit == '\0')))) {
    (*db->xRollbackCallback)(db->pRollbackArg);
    return;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3RollbackAll(sqlite3 *db, int tripCode){
  int i;
  int inTrans = 0;
  int schemaChange;
  assert( sqlite3_mutex_held(db->mutex) );
  sqlite3BeginBenignMalloc();

  /* Obtain all b-tree mutexes before making any calls to BtreeRollback(). 
  ** This is important in case the transaction being rolled back has
  ** modified the database schema. If the b-tree mutexes are not taken
  ** here, then another shared-cache connection might sneak in between
  ** the database rollback and schema reset, which can cause false
  ** corruption reports in some cases.  */
  sqlite3BtreeEnterAll(db);
  schemaChange = (db->flags & SQLITE_InternChanges)!=0 && db->init.busy==0;

  for(i=0; i<db->nDb; i++){
    Btree *p = db->aDb[i].pBt;
    if( p ){
      if( sqlite3BtreeIsInTrans(p) ){
        inTrans = 1;
      }
      sqlite3BtreeRollback(p, tripCode, !schemaChange);
    }
  }
  sqlite3VtabRollback(db);
  sqlite3EndBenignMalloc();

  if( (db->flags&SQLITE_InternChanges)!=0 && db->init.busy==0 ){
    sqlite3ExpirePreparedStatements(db);
    sqlite3ResetAllSchemasOfConnection(db);
  }
  sqlite3BtreeLeaveAll(db);

  /* Any deferred constraint violations have now been resolved. */
  db->nDeferredCons = 0;
  db->nDeferredImmCons = 0;
  db->flags &= ~SQLITE_DeferFKs;

  /* If one has been configured, invoke the rollback-hook callback */
  if( db->xRollbackCallback && (inTrans || !db->autoCommit) ){
    db->xRollbackCallback(db->pRollbackArg);
  }
}